

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

void run_container_smart_append_exclusive(run_container_t *src,uint16_t start,uint16_t length)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  ushort uVar5;
  long lVar6;
  rle16_t *prVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint16_t uVar11;
  
  iVar3 = src->n_runs;
  lVar6 = (long)iVar3;
  if (lVar6 == 0) {
    prVar7 = (rle16_t *)0x0;
  }
  else {
    prVar7 = src->runs + lVar6 + -1;
  }
  prVar4 = src->runs;
  if (iVar3 != 0) {
    uVar8 = (uint)start;
    uVar1 = prVar7->value;
    uVar2 = prVar7->length;
    uVar9 = (uint)uVar2 + (uint)uVar1;
    uVar10 = (uint)uVar2 + (uint)uVar1 + 1;
    if (uVar8 <= uVar10) {
      if (uVar10 == uVar8) {
        prVar7->length = length + uVar2 + 1;
        return;
      }
      uVar11 = length + start + 1;
      uVar8 = length + uVar8;
      uVar2 = (ushort)uVar9;
      uVar5 = (ushort)uVar8;
      if (uVar1 == start) {
        if (uVar8 < uVar9) {
          prVar7->value = uVar11;
          prVar7->length = uVar2 + ~uVar5;
          return;
        }
        if (uVar9 < uVar8) {
          prVar7->value = (uint16_t)uVar10;
          prVar7->length = uVar5 + ~uVar2;
          return;
        }
        src->n_runs = iVar3 + -1;
        return;
      }
      prVar7->length = start + ~uVar1;
      if (uVar8 < uVar9) {
        prVar4[lVar6].value = uVar11;
        prVar4[lVar6].length = uVar2 + ~uVar5;
      }
      else {
        if (uVar8 <= uVar9) {
          return;
        }
        prVar4[lVar6].value = (uint16_t)uVar10;
        prVar4[lVar6].length = uVar5 + ~uVar2;
      }
      goto LAB_00120cba;
    }
  }
  prVar4[lVar6].value = start;
  prVar4[lVar6].length = length;
LAB_00120cba:
  src->n_runs = iVar3 + 1;
  return;
}

Assistant:

void run_container_smart_append_exclusive(run_container_t *src,
                                          const uint16_t start,
                                          const uint16_t length) {
    int old_end;
    rle16_t *last_run = src->n_runs ? src->runs + (src->n_runs - 1) : NULL;
    rle16_t *appended_last_run = src->runs + src->n_runs;

    if (!src->n_runs ||
        (start > (old_end = last_run->value + last_run->length + 1))) {
        *appended_last_run = MAKE_RLE16(start, length);
        src->n_runs++;
        return;
    }
    if (old_end == start) {
        // we merge
        last_run->length += (length + 1);
        return;
    }
    int new_end = start + length + 1;

    if (start == last_run->value) {
        // wipe out previous
        if (new_end < old_end) {
            *last_run = MAKE_RLE16(new_end, old_end - new_end - 1);
            return;
        } else if (new_end > old_end) {
            *last_run = MAKE_RLE16(old_end, new_end - old_end - 1);
            return;
        } else {
            src->n_runs--;
            return;
        }
    }
    last_run->length = start - last_run->value - 1;
    if (new_end < old_end) {
        *appended_last_run = MAKE_RLE16(new_end, old_end - new_end - 1);
        src->n_runs++;
    } else if (new_end > old_end) {
        *appended_last_run = MAKE_RLE16(old_end, new_end - old_end - 1);
        src->n_runs++;
    }
}